

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O1

Nonnull<const_char_*> __thiscall
absl::lts_20250127::BadStatusOrAccess::what(BadStatusOrAccess *this)

{
  anon_class_8_1_8991fb9c *in_RDX;
  BadStatusOrAccess *local_10;
  
  if ((this->init_what_).control_.super___atomic_base<unsigned_int>._M_i != 0xdd) {
    local_10 = this;
    base_internal::CallOnceImpl<absl::lts_20250127::BadStatusOrAccess::InitWhat()const::__0>
              (&(this->init_what_).control_,(SchedulingMode)&local_10,in_RDX);
  }
  return (this->what_)._M_dataplus._M_p;
}

Assistant:

absl::Nonnull<const char*> BadStatusOrAccess::what() const noexcept {
  InitWhat();
  return what_.c_str();
}